

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbeddedClasses.cpp
# Opt level: O3

void chatra::String::native_equals
               (NativeCallHandler handler,Thread *thread,ObjectBase *object,StringId name,
               StringId subName,Tuple *args,Reference ret)

{
  Lockable *pLVar1;
  char cVar2;
  ReferenceNode *pRVar3;
  Object *pOVar4;
  Requester RVar5;
  undefined8 uVar6;
  int iVar7;
  bool bVar8;
  size_type *local_70;
  string lValue;
  string rValue;
  
  pRVar3 = ((args->super_ObjectBase).super_Object.refsArray.
            super__Vector_base<chatra::Reference,_std::allocator<chatra::Reference>_>._M_impl.
            super__Vector_impl_data._M_start)->node;
  if (((pRVar3->type == Object) && (pRVar3->object != (Object *)0x0)) &&
     (pRVar3->object[1]._vptr_Object == clString)) {
    lValue._M_dataplus._M_p = (pointer)0x0;
    lValue._M_string_length._0_1_ = 0;
    do {
      LOCK();
      cVar2 = *(char *)&object[1].super_Object._vptr_Object;
      *(undefined1 *)&object[1].super_Object._vptr_Object = 1;
      UNLOCK();
    } while (cVar2 != '\0');
    local_70 = &lValue._M_string_length;
    std::__cxx11::string::_M_assign((string *)&local_70);
    *(undefined1 *)&object[1].super_Object._vptr_Object = 0;
    rValue._M_dataplus._M_p = (pointer)0x0;
    rValue._M_string_length._0_1_ = 0;
    pOVar4 = pRVar3->object;
    do {
      LOCK();
      pLVar1 = &pOVar4[1].super_Lockable;
      RVar5 = (pLVar1->lockRequester)._M_i;
      *(undefined1 *)&(pLVar1->lockRequester)._M_i = 1;
      UNLOCK();
    } while ((char)RVar5 != 0);
    lValue.field_2._8_8_ = &rValue._M_string_length;
    std::__cxx11::string::_M_assign((string *)(lValue.field_2._M_local_buf + 8));
    uVar6 = lValue.field_2._8_8_;
    *(undefined1 *)&pOVar4[1].super_Lockable.lockRequester._M_i = 0;
    if (lValue._M_dataplus._M_p == rValue._M_dataplus._M_p) {
      if (lValue._M_dataplus._M_p == (pointer)0x0) {
        bVar8 = true;
      }
      else {
        iVar7 = bcmp(local_70,(void *)lValue.field_2._8_8_,(size_t)lValue._M_dataplus._M_p);
        bVar8 = iVar7 == 0;
      }
    }
    else {
      bVar8 = false;
    }
    (ret.node)->type = Bool;
    (ret.node)->object = (Object *)0x0;
    ((ret.node)->field_3).vBool = bVar8;
    if ((size_type *)uVar6 != &rValue._M_string_length) {
      operator_delete((void *)uVar6);
    }
    if (local_70 != &lValue._M_string_length) {
      operator_delete(local_70);
    }
  }
  else {
    (ret.node)->type = Bool;
    (ret.node)->object = (Object *)0x0;
    ((ret.node)->field_3).vBool = false;
  }
  return;
}

Assistant:

void String::native_equals(CHATRA_NATIVE_ARGS) {
	CHATRA_NATIVE_SELF;

	auto value = args.ref(0);
	if (value.isNull() || value.valueType() != ReferenceValueType::Object ||
			value.deref<ObjectBase>().getClass() != getClassStatic()) {
		ret.setBool(false);
		return;
	}

	std::string lValue;
	{
		std::lock_guard<SpinLock> lock(self.lockValue);
		lValue = self.value;
	}

	std::string rValue;
	{
		auto& target = value.deref<String>();
		std::lock_guard<SpinLock> lock(target.lockValue);
		rValue = target.value;
	}

	ret.setBool(lValue == rValue);
}